

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::~Fl_Widget_Type(Fl_Widget_Type *this)

{
  Fl_Group *this_00;
  long lVar1;
  
  (this->super_Fl_Type)._vptr_Fl_Type = (_func_int **)&PTR_setlabel_00272db0;
  if (this->o != (Fl_Widget *)0x0) {
    (*this->o->_vptr_Fl_Widget[6])();
    this_00 = this->o->parent_;
    if (this_00 != (Fl_Group *)0x0) {
      Fl_Group::remove(this_00,(char *)this->o);
    }
    if (this->o != (Fl_Widget *)0x0) {
      (*this->o->_vptr_Fl_Widget[1])();
    }
  }
  if (this->subclass_ != (char *)0x0) {
    free(this->subclass_);
  }
  if (this->tooltip_ != (char *)0x0) {
    free(this->tooltip_);
  }
  if (this->image_name_ != (char *)0x0) {
    free(this->image_name_);
    if (this->image != (Fluid_Image *)0x0) {
      Fluid_Image::decrement(this->image);
    }
  }
  if (this->inactive_name_ != (char *)0x0) {
    free(this->inactive_name_);
    if (this->inactive != (Fluid_Image *)0x0) {
      Fluid_Image::decrement(this->inactive);
    }
  }
  lVar1 = 0xf;
  do {
    if (this->extra_code_[lVar1 + -0xf] != (char *)0x0) {
      free(this->extra_code_[lVar1 + -0xf]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x13);
  Fl_Type::~Fl_Type(&this->super_Fl_Type);
  return;
}

Assistant:

Fl_Widget_Type::~Fl_Widget_Type() {
  if (o) {
    o->hide();
    if (o->parent()) ((Fl_Group*)o->parent())->remove(*o);
    delete o;
  }
  if (subclass_) free((void*)subclass_);
  if (tooltip_) free((void*)tooltip_);
  if (image_name_) {
    free((void*)image_name_);
    if (image) image->decrement();
  }
  if (inactive_name_) {
    free((void*)inactive_name_);
    if (inactive) inactive->decrement();
  }
  for (int n=0; n<NUM_EXTRA_CODE; n++) {
    if (extra_code_[n]) free((void*) extra_code_[n]);
  }
}